

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op-gvec.c
# Opt level: O3

void expand_2sh_vec(TCGContext_conflict9 *tcg_ctx,uint vece,uint32_t dofs,uint32_t aofs,
                   uint32_t oprsz,uint32_t tysz,TCGType_conflict type,TCGv_i32 shift,
                   _func_void_TCGContext_ptr_uint_TCGv_vec_TCGv_vec_TCGv_i32_conflict9 *fni)

{
  TCGv_vec r;
  uint uVar1;
  uintptr_t o;
  
  r = tcg_temp_new_vec_tricore(tcg_ctx,type);
  if (oprsz != 0) {
    uVar1 = 0;
    do {
      tcg_gen_ld_vec_tricore(tcg_ctx,r,tcg_ctx->cpu_env,(ulong)(aofs + uVar1));
      (*fni)(tcg_ctx,vece,r,r,shift);
      tcg_gen_st_vec_tricore(tcg_ctx,r,tcg_ctx->cpu_env,(ulong)(dofs + uVar1));
      uVar1 = uVar1 + tysz;
    } while (uVar1 < oprsz);
  }
  tcg_temp_free_internal_tricore(tcg_ctx,(TCGTemp *)(r + (long)tcg_ctx));
  return;
}

Assistant:

static void expand_2sh_vec(TCGContext *tcg_ctx, unsigned vece, uint32_t dofs, uint32_t aofs,
                           uint32_t oprsz, uint32_t tysz, TCGType type,
                           TCGv_i32 shift,
                           void (*fni)(TCGContext *, unsigned, TCGv_vec, TCGv_vec, TCGv_i32))
{
    TCGv_vec t0 = tcg_temp_new_vec(tcg_ctx, type);
    uint32_t i;

    for (i = 0; i < oprsz; i += tysz) {
        tcg_gen_ld_vec(tcg_ctx, t0, tcg_ctx->cpu_env, aofs + i);
        fni(tcg_ctx, vece, t0, t0, shift);
        tcg_gen_st_vec(tcg_ctx, t0, tcg_ctx->cpu_env, dofs + i);
    }
    tcg_temp_free_vec(tcg_ctx, t0);
}